

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

string * __thiscall Expression::describe_abi_cxx11_(string *__return_storage_ptr__,Expression *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Expression *local_18;
  Expression *this_local;
  
  local_18 = this;
  this_local = (Expression *)__return_storage_ptr__;
  (**(this->P1->super_AST)._vptr_AST)();
  std::operator+(&local_78,&local_98," ");
  (**(this->O->super_Terminal).super_AST._vptr_AST)(&local_c8);
  std::operator+(&local_58,&local_78,&local_c8);
  std::operator+(&local_38,&local_58," ");
  (**(this->P2->super_AST)._vptr_AST)(&local_e8);
  std::operator+(__return_storage_ptr__,&local_38,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string Expression::describe() {
    return P1->describe() + " " + O->describe() + " " + P2->describe();
}